

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_patchins(FuncState *fs,BCPos pc,BCPos dest)

{
  uint uVar1;
  BCPos offset;
  BCIns *jmp;
  BCPos dest_local;
  BCPos pc_local;
  FuncState *fs_local;
  
  uVar1 = (dest - (pc + 1)) + 0x8000;
  if (0xffff < uVar1) {
    err_syntax(fs->ls,LJ_ERR_XJUMP);
  }
  *(short *)((long)&fs->bcbase[pc].ins + 2) = (short)uVar1;
  return;
}

Assistant:

static void jmp_patchins(FuncState *fs, BCPos pc, BCPos dest)
{
  BCIns *jmp = &fs->bcbase[pc].ins;
  BCPos offset = dest-(pc+1)+BCBIAS_J;
  lj_assertFS(dest != NO_JMP, "uninitialized jump target");
  if (offset > BCMAX_D)
    err_syntax(fs->ls, LJ_ERR_XJUMP);
  setbc_d(jmp, offset);
}